

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PECommander.h
# Opt level: O0

void __thiscall
WrapperInfoCommand::execute(WrapperInfoCommand *this,CmdParams *params,CmdContext *context)

{
  ostream *poVar1;
  size_t sVar2;
  allocator<char> local_b1;
  string local_b0;
  size_t local_90;
  size_t wrapperIndx;
  size_t wrappersCount;
  ResourcesContainer *wrappers;
  allocator<char> local_61;
  string local_60;
  resource_type local_3c;
  size_t sStack_38;
  resource_type type;
  size_t dirsCount;
  ResourcesAlbum *album;
  PEFile *pe;
  CmdContext *context_local;
  CmdParams *params_local;
  WrapperInfoCommand *this_local;
  
  pe = (PEFile *)context;
  context_local = (CmdContext *)params;
  params_local = (CmdParams *)this;
  album = (ResourcesAlbum *)cmd_util::getPEFromContext(context);
  if (((PEFile *)album != (PEFile *)0x0) &&
     (dirsCount = (size_t)PEFile::getResourcesAlbum((PEFile *)album),
     (ResourcesAlbum *)dirsCount != (ResourcesAlbum *)0x0)) {
    sStack_38 = ResourcesAlbum::dirsCount((ResourcesAlbum *)dirsCount);
    if (sStack_38 == 0) {
      poVar1 = std::operator<<((ostream *)&std::cout,"No resources!");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    else {
      cmd_util::printResourceTypes((PEFile *)album);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"wrapper type",&local_61);
      sVar2 = cmd_util::readNumber(&local_60,false);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator(&local_61);
      local_3c = (resource_type)sVar2;
      wrappersCount = (size_t)PEFile::getResourcesOfType((PEFile *)album,(resource_type)sVar2);
      if ((ResourcesContainer *)wrappersCount == (ResourcesContainer *)0x0) {
        poVar1 = std::operator<<((ostream *)&std::cout,"No such resource type!");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      }
      else {
        wrapperIndx = ResourcesContainer::count((ResourcesContainer *)wrappersCount);
        if (wrapperIndx != 0) {
          local_90 = 0;
          if (1 < wrapperIndx) {
            poVar1 = std::operator<<((ostream *)&std::cout,"Wrappers count: ");
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,wrapperIndx);
            std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b0,"wrapperIndex",&local_b1);
            local_90 = cmd_util::readNumber(&local_b0,false);
            std::__cxx11::string::~string((string *)&local_b0);
            std::allocator<char>::~allocator(&local_b1);
          }
          cmd_util::dumpResourcesInfo((PEFile *)album,local_3c,local_90);
        }
      }
    }
  }
  return;
}

Assistant:

virtual void execute(CmdParams *params, CmdContext  *context)
    {
        PEFile *pe = cmd_util::getPEFromContext(context);
        if (!pe) return;

        ResourcesAlbum *album = pe->getResourcesAlbum();
        if (album == NULL) return;

        size_t dirsCount =  album->dirsCount();
        if (dirsCount == 0) {
            std::cout << "No resources!" << std::endl;
            return;
        }
        cmd_util::printResourceTypes(pe);

        pe::resource_type type = (pe::resource_type) cmd_util::readNumber("wrapper type");

        ResourcesContainer* wrappers = pe->getResourcesOfType(type);
        if (wrappers == NULL) {
            std::cout << "No such resource type!" << std::endl;
            return;
        }
        size_t wrappersCount = wrappers->count();
        if (wrappersCount == 0) {
            return;
        }
        size_t wrapperIndx = 0;
        if (wrappersCount > 1) {
            std::cout << "Wrappers count: " << std::dec << wrappersCount << std::endl;
            wrapperIndx = cmd_util::readNumber("wrapperIndex");
        }
        cmd_util::dumpResourcesInfo(pe, type, wrapperIndx);
    }